

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vpu720.c
# Opt level: O3

MPP_RET hal_jpege_vpu720_gen_regs(void *hal,HalEncTask *task)

{
  undefined8 *puVar1;
  void *__s;
  JpegeBits *bits;
  MppDev pvVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  RK_S32 RVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  RK_U8 *pRVar9;
  size_t sVar10;
  void *__dest;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  char *fmt;
  JpegeVpu720HalCtx *ctx;
  RK_U8 *pRVar17;
  long lVar18;
  long lVar19;
  undefined8 uVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  RK_U8 *qtable [2];
  
  __s = *(void **)((long)hal + 0x70);
  bits = *(JpegeBits **)((long)hal + 0xf0);
  qtable[0] = (RK_U8 *)0x0;
  qtable[1] = (RK_U8 *)0x0;
  sVar8 = mpp_packet_get_length(task->packet);
  pRVar9 = (RK_U8 *)mpp_buffer_get_ptr_with_caller(task->output,"hal_jpege_vpu720_gen_regs");
  sVar10 = mpp_buffer_get_size_with_caller(task->output,"hal_jpege_vpu720_gen_regs");
  __dest = mpp_buffer_get_ptr_with_caller
                     (*(MppBuffer *)((long)hal + 0x1c0),"hal_jpege_vpu720_gen_regs");
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vpu720","(%d) enter\n","hal_jpege_vpu720_gen_regs",0x183);
  }
  uVar23 = *(uint *)(*(long *)((long)hal + 0x80) + 0x24) & 0xfffff;
  puVar1 = (undefined8 *)((long)hal + 0x98);
  iVar7 = *(int *)((long)hal + 0x120);
  RVar3 = mpp_frame_get_hor_stride(task->frame);
  RVar4 = mpp_frame_get_ver_stride(task->frame);
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vpu720","(%d) enter\n","jpege_vpu720_setup_format",200);
  }
  *(undefined8 *)((long)hal + 0xc4) = 0;
  *(undefined8 *)((long)hal + 0xcc) = 0;
  *(undefined8 *)((long)hal + 0xb8) = 0;
  *(undefined8 *)((long)hal + 0xc0) = 0;
  *(undefined8 *)((long)hal + 0xa8) = 0;
  *(undefined8 *)((long)hal + 0xb0) = 0;
  *puVar1 = 0;
  *(undefined8 *)((long)hal + 0xa0) = 0;
  lVar18 = *(long *)((long)hal + 0x80);
  uVar6 = *(uint *)(lVar18 + 0x24);
  if ((uVar6 >> 0x19 & 1) != 0) {
    switch(uVar23) {
    case 0:
    case 4:
      *(undefined4 *)puVar1 = 1;
      RVar3 = RVar3 * 0xc >> 1;
      uVar20 = 1;
      break;
    default:
      fmt = "Unsupported input format 0x%08x, with TILE mask.\n";
      goto LAB_0024607a;
    case 2:
    case 6:
      *(undefined4 *)puVar1 = 2;
      RVar3 = RVar3 << 3;
      uVar20 = 2;
      break;
    case 0xc:
      *(RK_U32 *)((long)hal + 0xc4) = RVar3 << 2;
      RVar3 = 0;
      lVar13 = 0x9c;
      uVar20 = 0;
      goto LAB_0024615b;
    case 0xf:
    case 0x10:
      *(undefined4 *)puVar1 = 3;
      RVar3 = RVar3 * 0xc;
      uVar20 = 3;
    }
    goto LAB_00246156;
  }
  switch(uVar23) {
  case 0:
    *(undefined4 *)((long)hal + 0x98) = 6;
    *(RK_U32 *)((long)hal + 0xc4) = RVar3;
    *(RK_U32 *)((long)hal + 200) = RVar3;
    uVar20 = 6;
    goto LAB_002460f3;
  default:
    fmt = "Unsupported input format 0x%08x\n";
LAB_0024607a:
    _mpp_log_l(2,"hal_jpege_vpu720",fmt,(char *)0x0,(ulong)uVar23);
    goto LAB_0024626a;
  case 2:
    *(undefined4 *)((long)hal + 0x98) = 4;
    *(RK_U32 *)((long)hal + 0xc4) = RVar3;
    *(RK_U32 *)((long)hal + 200) = RVar3;
    uVar20 = 4;
    goto LAB_002460f3;
  case 4:
    *(undefined4 *)((long)hal + 0x98) = 7;
    *(RK_U32 *)((long)hal + 0xc4) = RVar3;
    *(RK_U32 *)((long)hal + 200) = RVar3 >> 1;
    *(RK_U32 *)((long)hal + 0xcc) = RVar4 * RVar3;
    RVar3 = (RVar4 >> 1) * (RVar3 >> 1) + RVar4 * RVar3;
    uVar20 = 7;
    goto LAB_002460ca;
  case 5:
    *(undefined4 *)((long)hal + 0x98) = 6;
    *(RK_U32 *)((long)hal + 0xc4) = RVar3;
    *(RK_U32 *)((long)hal + 200) = RVar3;
    *(RK_U32 *)((long)hal + 0xcc) = RVar4 * RVar3;
    uVar20 = 6;
    break;
  case 6:
    *(undefined4 *)((long)hal + 0x98) = 5;
    *(RK_U32 *)((long)hal + 0xc4) = RVar3;
    *(RK_U32 *)((long)hal + 200) = RVar3 >> 1;
    *(RK_U32 *)((long)hal + 0xcc) = RVar4 * RVar3;
    RVar3 = ((RVar3 >> 1) + RVar3) * RVar4;
    uVar20 = 5;
    lVar13 = 0xd0;
    goto LAB_0024615b;
  case 7:
    *(undefined4 *)((long)hal + 0x98) = 4;
    *(RK_U32 *)((long)hal + 0xc4) = RVar3;
    *(RK_U32 *)((long)hal + 200) = RVar3;
    *(RK_U32 *)((long)hal + 0xcc) = RVar4 * RVar3;
    uVar20 = 4;
    break;
  case 8:
    *(undefined4 *)puVar1 = 8;
    uVar20 = 8;
    goto LAB_00246156;
  case 9:
    *(undefined4 *)((long)hal + 0x98) = 8;
    *(RK_U32 *)((long)hal + 0xc4) = RVar3;
    uVar20 = 8;
    break;
  case 10:
    *(undefined4 *)puVar1 = 9;
    uVar20 = 9;
    goto LAB_00246156;
  case 0xb:
    *(undefined4 *)((long)hal + 0x98) = 9;
    *(RK_U32 *)((long)hal + 0xc4) = RVar3;
    uVar20 = 9;
    break;
  case 0xc:
    *(undefined4 *)puVar1 = 10;
    uVar20 = 10;
LAB_00246156:
    lVar13 = 0xc4;
    goto LAB_0024615b;
  case 0xf:
    *(undefined4 *)((long)hal + 0x98) = 0xc;
    *(RK_U32 *)((long)hal + 0xc4) = RVar3;
    *(RK_U32 *)((long)hal + 200) = RVar3 * 2;
    uVar20 = 0xc;
LAB_002460f3:
    RVar3 = RVar4 * RVar3;
    lVar13 = 0xcc;
    goto LAB_0024615b;
  case 0x10:
    *(undefined4 *)((long)hal + 0x98) = 0xd;
    *(RK_U32 *)((long)hal + 0xc4) = RVar3;
    *(RK_U32 *)((long)hal + 200) = RVar3;
    *(RK_U32 *)((long)hal + 0xcc) = RVar4 * RVar3;
    RVar3 = RVar4 * RVar3 * 2;
    uVar20 = 0xd;
LAB_002460ca:
    lVar13 = 0xd0;
    goto LAB_0024615b;
  }
  RVar3 = 1;
  lVar13 = 0xac;
LAB_0024615b:
  *(RK_U32 *)((long)hal + lVar13) = RVar3;
  uVar23 = iVar7 - 1;
  uVar22 = 1;
  if (uVar23 < 7) {
    uVar22 = (ulong)*(uint *)(&DAT_002b7524 + (ulong)uVar23 * 4);
  }
  *(int *)((long)hal + 0x9c) = (int)uVar22;
  *(undefined4 *)((long)hal + 0xc0) = *(undefined4 *)((long)hal + 0x19c);
  uVar23 = (uint)(*(int *)(lVar18 + 0x3c) == 2);
  *(uint *)((long)hal + 0xa8) = uVar23;
  if (((byte)hal_jpege_debug & 4) != 0) {
    _mpp_log_l(4,"hal_jpege_vpu720",
               "JPEG format: in 0x%x out 0x%x, hw in_fmt %d, out_fmt %d, ds_mode %d\n",(char *)0x0,
               (ulong)uVar6,(ulong)*(uint *)(lVar18 + 0x38),uVar20,uVar22,(ulong)uVar23);
    lVar18 = *(long *)((long)hal + 0x80);
  }
  if (*(int *)(lVar18 + 0x58) != 0) {
    *(undefined4 *)((long)hal + 0xb0) = 1;
  }
  if (*(int *)(lVar18 + 0x44) != 0) {
    *(undefined4 *)((long)hal + 0xb4) = 1;
    *(ulong *)((long)hal + 0xb8) = *(ulong *)(lVar18 + 0x48) & 0xff000000ff;
  }
  iVar7 = *(int *)(lVar18 + 0x34);
  if (iVar7 == 0) {
    iVar7 = 2;
  }
  *(int *)((long)hal + 0xa0) = iVar7;
  iVar7 = *(int *)(lVar18 + 0x40);
  if (iVar7 == 0) {
    iVar7 = 2;
  }
  *(int *)((long)hal + 0xa4) = iVar7;
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vpu720","(%d) leave\n","jpege_vpu720_setup_format",0x16d);
  }
LAB_0024626a:
  memset(__s,0,300);
  mpp_buffer_sync_begin_f(task->output,0,"hal_jpege_vpu720_gen_regs");
  jpege_bits_setup(bits,pRVar9,(RK_S32)sVar10);
  jpege_seek_bits(bits,(int)sVar8 << 3);
  write_jpeg_header(bits,(JpegeSyntax *)((long)hal + 0xf8),qtable);
  mpp_buffer_sync_end_f(task->output,0,"hal_jpege_vpu720_gen_regs");
  RVar5 = jpege_bits_get_bitpos(bits);
  uVar23 = RVar5 + 7 >> 3;
  task->length = uVar23;
  mpp_packet_set_length(task->packet,(ulong)uVar23);
  uVar23 = *(uint *)((long)__s + 4);
  *(uint *)((long)__s + 4) = uVar23 & 0xffffff00;
  *(uint *)((long)__s + 4) = uVar23 & 0xfffff000 | (*(uint *)((long)hal + 0x88) & 0xf) << 8;
  *(ulong *)((long)__s + 0x10) = *(ulong *)((long)__s + 0x10) | 0x1fff00001fff;
  *(byte *)((long)__s + 0x20) = *(byte *)((long)__s + 0x20) | 7;
  *(undefined2 *)((long)__s + 0xa8) = 0xf0f;
  *(int *)((long)__s + 0x2c) = *(int *)((long)hal + 0x110) * 1000;
  *(byte *)((long)__s + 0x68) = *(byte *)((long)__s + 0x68) | 3;
  lVar13 = *(long *)((long)hal + 0x1c8);
  lVar18 = lVar13 + 0x80;
  lVar19 = 0;
  pRVar9 = qtable[0];
  pRVar17 = qtable[1];
  do {
    lVar21 = 0;
    do {
      *(ushort *)(lVar18 + -0x80 + lVar21 * 2) = 0x8000 / pRVar9[lVar21 * 8];
      *(ushort *)(lVar18 + lVar21 * 2) = 0x8000 / pRVar17[lVar21 * 8];
      lVar21 = lVar21 + 1;
    } while (lVar21 != 8);
    lVar19 = lVar19 + 1;
    pRVar9 = pRVar9 + 1;
    pRVar17 = pRVar17 + 1;
    lVar18 = lVar18 + 0x10;
  } while (lVar19 != 8);
  memcpy((void *)(lVar13 + 0x100),(void *)(lVar13 + 0x80),0x80);
  uVar23 = -*(int *)((long)hal + 0x114) &
           (*(int *)((long)hal + 0xf8) + *(int *)((long)hal + 0x114)) - 1U;
  uVar6 = -*(int *)((long)hal + 0x118) &
          (*(int *)((long)hal + 0xfc) + *(int *)((long)hal + 0x118)) - 1U;
  *(uint *)((long)__s + 0x74) =
       uVar6 * 0x2000 + 0x1fff0000 & 0x1fff0000 |
       *(uint *)((long)__s + 0x74) & 0xe000e000 | (uVar23 >> 3) - 1 & 0x1fff;
  uVar11 = uVar23 - *(int *)((long)hal + 0xf8) & 0x3f;
  uVar23 = *(uint *)((long)__s + 0x78);
  *(uint *)((long)__s + 0x78) = uVar23 & 0xffffffc0 | uVar11;
  *(uint *)((long)__s + 0x78) =
       uVar23 & 0xffc0ffc0 | uVar11 | (uVar6 - *(int *)((long)hal + 0xfc) & 0x3f) << 0x10;
  uVar23 = (*(uint *)((long)__s + 0x80) & 0xffffffc3) + (*(uint *)((long)hal + 0x98) & 0xf) * 4;
  *(uint *)((long)__s + 0x80) = uVar23;
  uVar6 = (*(uint *)((long)hal + 0x9c) & 3) << 6;
  *(uint *)((long)__s + 0x80) = uVar23 & 0xffffff3f | uVar6;
  uVar23 = (uVar23 & 0xffffff3d | uVar6) + (*(uint *)((long)hal + 0xac) & 1) * 2;
  *(uint *)((long)__s + 0x80) = uVar23;
  uVar14 = (*(uint *)((long)hal + 0xa8) & 1) << 0xb;
  *(uint *)((long)__s + 0x80) = uVar23 & 0xfffff7ff | uVar14;
  uVar15 = (*(uint *)((long)hal + 0xb0) & 1) << 0xf;
  *(uint *)((long)__s + 0x80) = uVar23 & 0xffff77ff | uVar14 | uVar15;
  uVar16 = (*(uint *)((long)hal + 0xb4) & 1) << 0xc;
  *(uint *)((long)__s + 0x80) = uVar23 & 0xffff67ff | uVar14 | uVar15 | uVar16;
  uVar11 = (*(uint *)((long)hal + 0xb8) & 0xff) << 0x10;
  *(uint *)((long)__s + 0x80) = uVar23 & 0xff0067ff | uVar14 | uVar15 | uVar16 | uVar11;
  uVar12 = *(int *)((long)hal + 0xbc) << 0x18;
  uVar6 = uVar23 & 0x67ff | uVar14 | uVar15 | uVar16 | uVar11 | uVar12;
  *(uint *)((long)__s + 0x80) = uVar6;
  if (*(int *)((long)hal + 0xa0) != *(int *)((long)hal + 0xa4)) {
    *(uint *)((long)__s + 0x80) = uVar6 | 0x200;
    uVar23 = uVar23 & 0x63ff | uVar14 | uVar15 | uVar16 | uVar11 | uVar12 | 0x200;
    if (*(int *)((long)hal + 0xa0) == 1) {
      uVar23 = uVar6 | 0x600;
    }
    *(uint *)((long)__s + 0x80) = uVar23;
  }
  RVar3 = mpp_frame_get_offset_x(task->frame);
  *(short *)((long)__s + 0x84) = (short)RVar3;
  RVar3 = mpp_frame_get_offset_y(task->frame);
  *(short *)((long)__s + 0x86) = (short)RVar3;
  *(uint *)((long)__s + 0x88) =
       *(uint *)((long)__s + 0x88) & 0xfff00000 | *(uint *)((long)hal + 0xc4) & 0xfffff;
  *(uint *)((long)__s + 0x8c) =
       *(uint *)((long)__s + 0x8c) & 0xfff80000 | *(uint *)((long)hal + 200) & 0x7ffff;
  *(uint *)((long)__s + 0x90) =
       (*(uint *)((long)__s + 0x90) & 0xc3ff0000) + (uint)*(ushort *)((long)hal + 0x198) +
       0x20000000;
  iVar7 = mpp_buffer_get_fd_with_caller(task->input,"hal_jpege_vpu720_gen_regs");
  *(int *)((long)__s + 0x58) = iVar7;
  *(int *)((long)__s + 0x5c) = iVar7;
  *(int *)((long)__s + 0x60) = iVar7;
  iVar7 = mpp_buffer_get_fd_with_caller(task->output,"hal_jpege_vpu720_gen_regs");
  *(int *)((long)__s + 0x44) = iVar7;
  *(int *)((long)__s + 0x48) = iVar7;
  *(int *)((long)__s + 0x4c) = iVar7;
  *(int *)((long)__s + 0x50) = iVar7;
  iVar7 = mpp_buffer_get_fd_with_caller
                    (*(MppBuffer *)((long)hal + 0x1c0),"hal_jpege_vpu720_gen_regs");
  *(int *)((long)__s + 0x40) = iVar7;
  memcpy(__dest,*(void **)((long)hal + 0x1c8),0x180);
  mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x1c0),0,"hal_jpege_vpu720_gen_regs");
  pvVar2 = *(MppDev *)((long)hal + 0x68);
  sVar8 = mpp_packet_get_length(task->packet);
  mpp_dev_set_reg_offset(pvVar2,0x14,(RK_U32)sVar8);
  pvVar2 = *(MppDev *)((long)hal + 0x68);
  sVar8 = mpp_buffer_get_size_with_caller(task->output,"hal_jpege_vpu720_gen_regs");
  mpp_dev_set_reg_offset(pvVar2,0x11,(RK_U32)sVar8);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x68),0x17,*(RK_U32 *)((long)hal + 0xcc));
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x68),0x18,*(RK_U32 *)((long)hal + 0xd0));
  *(int *)((long)hal + 0xec) = *(int *)((long)hal + 0xec) + 1;
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vpu720","(%d) leave\n","hal_jpege_vpu720_gen_regs",0x201);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_jpege_vpu720_gen_regs(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    JpegeVpu720HalCtx *ctx = (JpegeVpu720HalCtx *) hal;
    JpegeVpu720Reg *regs = ctx->regs;
    JpegeVpu720BaseReg *reg_base = &regs->reg_base;
    JpegeBits bits = ctx->bits;
    const RK_U8 *qtable[2] = {NULL};
    size_t length = mpp_packet_get_length(task->packet);
    RK_U8 *buf = mpp_buffer_get_ptr(task->output);
    size_t size = mpp_buffer_get_size(task->output);
    JpegeSyntax *syntax = &ctx->syntax;
    RK_U8 *qtbl_base = (RK_U8 *)mpp_buffer_get_ptr(ctx->qtbl_buffer);
    RK_S32 bitpos;
    RK_U32 i, j;
    RK_U32 encode_width;
    RK_U32 encode_height;

    hal_jpege_enter();

    jpege_vpu720_setup_format(hal, task);

    memset(regs, 0, sizeof(JpegeVpu720Reg));

    mpp_buffer_sync_begin(task->output);
    jpege_bits_setup(bits, buf, (RK_U32)size);
    jpege_seek_bits(bits, length << 3);
    write_jpeg_header(bits, syntax, qtable);
    mpp_buffer_sync_end(task->output);

    bitpos = jpege_bits_get_bitpos(bits);
    task->length = (bitpos + 7) >> 3;

    mpp_packet_set_length(task->packet, task->length);

    reg_base->reg001_enc_strt.lkt_num = 0;
    reg_base->reg001_enc_strt.vepu_cmd = ctx->enc_mode;

    // interupt
    reg_base->reg004_int_en.fenc_done_en = 1;
    reg_base->reg004_int_en.lkt_node_done_en = 1;
    reg_base->reg004_int_en.sclr_done_en = 1;
    reg_base->reg004_int_en.vslc_done_en = 1;
    reg_base->reg004_int_en.vbsb_oflw_en = 1;
    reg_base->reg004_int_en.vbsb_sct_en = 1;
    reg_base->reg004_int_en.fenc_err_en = 1;
    reg_base->reg004_int_en.wdg_en = 1;
    reg_base->reg004_int_en.lkt_oerr_en = 1;
    reg_base->reg004_int_en.lkt_estp_en = 1;
    reg_base->reg004_int_en.lkt_fstp_en = 1;
    reg_base->reg004_int_en.lkt_note_stp_en = 1;
    reg_base->reg004_int_en.lkt_data_error_en = 1;

    reg_base->reg005_int_msk.fenc_done_msk = 1;
    reg_base->reg005_int_msk.lkt_node_done_msk = 1;
    reg_base->reg005_int_msk.sclr_done_msk = 1;
    reg_base->reg005_int_msk.vslc_done_msk = 1;
    reg_base->reg005_int_msk.vbsb_oflw_msk = 1;
    reg_base->reg005_int_msk.vbsb_sct_msk = 1;
    reg_base->reg005_int_msk.fenc_err_msk = 1;
    reg_base->reg005_int_msk.wdg_msk = 1;
    reg_base->reg005_int_msk.lkt_oerr_msk = 1;
    reg_base->reg005_int_msk.lkt_estp_msk = 1;
    reg_base->reg005_int_msk.lkt_fstp_msk = 1;
    reg_base->reg005_int_msk.lkt_note_stp_msk = 1;
    reg_base->reg005_int_msk.lkt_data_error_msk = 1;

    reg_base->reg008_cru_ctrl.resetn_hw_en = 1;
    reg_base->reg008_cru_ctrl.sram_ckg_en = 1;
    reg_base->reg008_cru_ctrl.cke = 1;

    reg_base->reg042_dbus_endn.jbsw_bus_edin = 0xf;
    reg_base->reg042_dbus_endn.vsl_bus_edin = 0;
    reg_base->reg042_dbus_endn.ecs_len_edin = 0xf;
    reg_base->reg042_dbus_endn.sw_qtbl_edin = 0;

    reg_base->reg011_wdg_jpeg = syntax->mcu_cnt * 1000;

    reg_base->reg026_axi_perf_ctrl0.perf_work_e = 1;
    reg_base->reg026_axi_perf_ctrl0.perf_clr_e = 1;

    for (i = 0; i < 8; i++) {
        for (j = 0; j < 8; j++) {
            ctx->qtbl_sw_buf[i * 8 + j] = 0x8000 / qtable[0][j * 8 + i];
            ctx->qtbl_sw_buf[64 + i * 8 + j] = 0x8000 / qtable[1][j * 8 + i];
        }
    }

    memcpy(&ctx->qtbl_sw_buf[64 * 2], &ctx->qtbl_sw_buf[64], sizeof(RK_U16) * 64);

    encode_width = MPP_ALIGN(syntax->width, syntax->mcu_width);
    encode_height = MPP_ALIGN(syntax->height, syntax->mcu_height);
    reg_base->reg029_sw_enc_rsl.pic_wd8_m1 = encode_width / 8 - 1;
    reg_base->reg029_sw_enc_rsl.pic_hd8_m1 = encode_height / 8 - 1;
    reg_base->reg030_sw_src_fill.pic_wfill_jpeg = encode_width - syntax->width;
    reg_base->reg030_sw_src_fill.pic_hfill_jpeg = encode_height - syntax->height;

    reg_base->reg032_sw_src_fmt.src_fmt = ctx->fmt_cfg.input_format;
    reg_base->reg032_sw_src_fmt.out_fmt = ctx->fmt_cfg.out_format;
    reg_base->reg032_sw_src_fmt.rbuv_swap_jpeg = ctx->fmt_cfg.uv_swap;
    reg_base->reg032_sw_src_fmt.chroma_ds_mode = ctx->fmt_cfg.chroma_ds_mode;
    reg_base->reg032_sw_src_fmt.src_mirr_jpeg = ctx->fmt_cfg.mirror;
    reg_base->reg032_sw_src_fmt.chroma_force_en = ctx->fmt_cfg.fix_chroma_en;
    reg_base->reg032_sw_src_fmt.u_force_value = ctx->fmt_cfg.fix_chroma_u;
    reg_base->reg032_sw_src_fmt.v_force_value = ctx->fmt_cfg.fix_chroma_v;

    if (ctx->fmt_cfg.src_range != ctx->fmt_cfg.dst_range) {
        reg_base->reg032_sw_src_fmt.src_range_trns_en = 1;
        if (ctx->fmt_cfg.src_range == MPP_FRAME_RANGE_MPEG)
            reg_base->reg032_sw_src_fmt.src_range_trns_sel = JPEG_VPU720_COLOR_RANGE_LIMIT_TO_FULL;
        else
            reg_base->reg032_sw_src_fmt.src_range_trns_sel = JPEG_VPU720_COLOR_RANGE_FULL_TO_LIMIT;
    }

    reg_base->reg033_sw_pic_ofst.pic_ofst_x = mpp_frame_get_offset_x(task->frame);
    reg_base->reg033_sw_pic_ofst.pic_ofst_y = mpp_frame_get_offset_y(task->frame);

    reg_base->reg034_sw_src_strd_0.src_strd_0 = ctx->fmt_cfg.y_stride;
    reg_base->reg035_sw_src_strd_1.src_strd_1 = ctx->fmt_cfg.uv_stride;

    reg_base->reg036_sw_jpeg_enc_cfg.rst_intv = syntax->restart_ri;
    reg_base->reg036_sw_jpeg_enc_cfg.rst_m = 0;
    reg_base->reg036_sw_jpeg_enc_cfg.pic_last_ecs = 1;

    reg_base->reg022_adr_src0 = mpp_buffer_get_fd(task->input);
    reg_base->reg023_adr_src1 = reg_base->reg022_adr_src0;
    reg_base->reg024_adr_src2 = reg_base->reg022_adr_src0;

    reg_base->reg017_adr_bsbt = mpp_buffer_get_fd(task->output);
    reg_base->reg018_adr_bsbb = reg_base->reg017_adr_bsbt;
    reg_base->reg019_adr_bsbr = reg_base->reg017_adr_bsbt;
    reg_base->reg020_adr_bsbs = reg_base->reg017_adr_bsbt;

    reg_base->reg016_adr_qtbl = mpp_buffer_get_fd(ctx->qtbl_buffer);
    memcpy(qtbl_base, ctx->qtbl_sw_buf, JPEGE_VPU720_QTABLE_SIZE * sizeof(RK_U16));
    mpp_buffer_sync_end(ctx->qtbl_buffer);

    mpp_dev_set_reg_offset(ctx->dev, 20, mpp_packet_get_length(task->packet));
    mpp_dev_set_reg_offset(ctx->dev, 17, mpp_buffer_get_size(task->output));
    mpp_dev_set_reg_offset(ctx->dev, 23, ctx->fmt_cfg.u_offset);
    mpp_dev_set_reg_offset(ctx->dev, 24, ctx->fmt_cfg.v_offset);

    ctx->frame_num++;

    hal_jpege_leave();
    return ret;
}